

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O1

void correctResiduals(HighsLpSolverObject *solver_object)

{
  double dVar1;
  double dVar2;
  int iVar3;
  HighsOptions *pHVar4;
  HighsLp *pHVar5;
  HighsSolution *pHVar6;
  pointer pdVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  vector<double,_std::allocator<double>_> check_col_dual;
  vector<double,_std::allocator<double>_> check_row_value;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_38;
  
  pHVar4 = solver_object->options_;
  pHVar5 = solver_object->lp_;
  pHVar6 = solver_object->solution_;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  HighsSparseMatrix::productQuad(&pHVar5->a_matrix_,&local_38,&pHVar6->col_value,-2);
  if (pHVar6->dual_valid == true) {
    HighsSparseMatrix::productTransposeQuad(&pHVar5->a_matrix_,&local_58,&pHVar6->row_dual,-2);
    iVar3 = pHVar5->num_col_;
    if (0 < (long)iVar3) {
      pdVar7 = (pHVar5->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      do {
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar9] =
             local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar9] - pdVar7[lVar9];
        lVar9 = lVar9 + 1;
      } while (iVar3 != lVar9);
    }
  }
  dVar1 = (pHVar4->super_HighsOptionsStruct).dual_residual_tolerance;
  iVar3 = pHVar5->num_row_;
  iVar10 = 0;
  dVar12 = 0.0;
  dVar11 = 0.0;
  iVar8 = 0;
  if (0 < (long)iVar3) {
    dVar2 = (pHVar4->super_HighsOptionsStruct).primal_residual_tolerance;
    pdVar7 = (pHVar6->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    iVar8 = 0;
    do {
      dVar15 = pdVar7[lVar9];
      dVar14 = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar9] - dVar15;
      dVar13 = ABS(dVar14);
      if (dVar2 < dVar13) {
        pdVar7[lVar9] = dVar15 + dVar14;
        iVar8 = iVar8 + 1;
        if (dVar12 <= dVar13) {
          dVar12 = dVar13;
        }
      }
      if (dVar11 <= dVar13) {
        dVar11 = dVar13;
      }
      lVar9 = lVar9 + 1;
    } while (iVar3 != lVar9);
  }
  if (pHVar6->dual_valid == true) {
    iVar3 = pHVar5->num_col_;
    dVar11 = 0.0;
    if (0 < (long)iVar3) {
      pdVar7 = (pHVar6->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      iVar10 = 0;
      dVar12 = 0.0;
      do {
        dVar2 = pdVar7[lVar9];
        dVar13 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9] + dVar2;
        dVar15 = ABS(dVar13);
        if (dVar1 < dVar15) {
          pdVar7[lVar9] = dVar2 - dVar13;
          iVar10 = iVar10 + 1;
          if (dVar11 <= dVar15) {
            dVar11 = dVar15;
          }
        }
        if (dVar12 <= dVar15) {
          dVar12 = dVar15;
        }
        lVar9 = lVar9 + 1;
      } while (iVar3 != lVar9);
    }
  }
  if (0 < iVar10 || 0 < iVar8) {
    highsLogUser(&(pHVar4->super_HighsOptionsStruct).log_options,kWarning,
                 "LP solver residuals: primal = %g; dual = %g yield num/max/sum primal (%d/%g/%g) and dual (%d/%g/%g) corrections\n"
                );
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void correctResiduals(HighsLpSolverObject& solver_object) {
  HighsOptions& options = solver_object.options_;
  HighsSolution& solution = solver_object.solution_;
  const bool& have_primal_solution = solution.value_valid;
  const bool& have_dual_solution = solution.dual_valid;
  assert(have_primal_solution);
  assert(have_dual_solution);
  HighsLp& lp = solver_object.lp_;
  std::vector<double> check_row_value;
  std::vector<double> check_col_dual;
  lp.a_matrix_.productQuad(check_row_value, solution.col_value);
  if (have_dual_solution) {
    lp.a_matrix_.productTransposeQuad(check_col_dual, solution.row_dual);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      check_col_dual[iCol] -= lp.col_cost_[iCol];
  }
  double norm_primal_residual = 0;
  HighsInt num_primal_correction = 0;
  double max_primal_correction = 0;
  double sum_primal_correction = 0;
  double use_primal_residual_tolerance = options.primal_residual_tolerance;

  double norm_dual_residual = 0;
  HighsInt num_dual_correction = 0;
  double max_dual_correction = 0;
  double sum_dual_correction = 0;
  double use_dual_residual_tolerance = options.dual_residual_tolerance;

  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    double primal_residual = check_row_value[iRow] - solution.row_value[iRow];
    double abs_primal_residual = std::fabs(primal_residual);
    if (abs_primal_residual > use_primal_residual_tolerance) {
      solution.row_value[iRow] += primal_residual;
      double check_primal_residual =
          std::fabs(check_row_value[iRow] - solution.row_value[iRow]);
      assert(check_primal_residual < 1e-10);
      num_primal_correction++;
      max_primal_correction =
          std::max(abs_primal_residual, max_primal_correction);
      sum_primal_correction += abs_primal_residual;
    }
    norm_primal_residual = std::max(abs_primal_residual, norm_primal_residual);
  }
  if (have_dual_solution) {
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      double dual_residual = check_col_dual[iCol] + solution.col_dual[iCol];
      double abs_dual_residual = std::fabs(dual_residual);
      if (abs_dual_residual > use_dual_residual_tolerance) {
        solution.col_dual[iCol] -= dual_residual;
        num_dual_correction++;
        max_dual_correction = std::max(abs_dual_residual, max_dual_correction);
        sum_dual_correction += abs_dual_residual;
      }
      norm_dual_residual = std::max(abs_dual_residual, norm_dual_residual);
    }
  }

  if (num_primal_correction > 0 || num_dual_correction > 0)
    highsLogUser(
        options.log_options, HighsLogType::kWarning,
        "LP solver residuals: primal = %g; dual = %g yield num/max/sum primal "
        "(%d/%g/%g) and dual (%d/%g/%g) corrections\n",
        norm_primal_residual, norm_dual_residual, int(num_primal_correction),
        max_primal_correction, sum_primal_correction, int(num_dual_correction),
        max_dual_correction, sum_dual_correction);
}